

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined1 in_stack_00000000 [12];
  ZSTD_compressionParameters cParams;
  ZSTD_dictLoadMethod_e in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  ZSTD_getCParams_internal
            (dictSize._4_4_,CONCAT44(compressionLevel,cParams.strategy),cParams._16_8_,
             cParams.searchLog);
  cParams_00.chainLog = in_ESI;
  cParams_00.windowLog = in_stack_fffffffffffffff0;
  cParams_00.hashLog = (int)in_RDI;
  cParams_00.searchLog = (int)((ulong)in_RDI >> 0x20);
  cParams_00._16_12_ = in_stack_00000000;
  sVar1 = ZSTD_estimateCDictSize_advanced
                    (in_stack_ffffffffffffffe0,cParams_00,in_stack_ffffffffffffffdc);
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}